

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

ParamIteratorInterface<std::tuple<unsigned_long,_unsigned_long>_> * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<std::tuple<unsigned_long,_unsigned_long>_>::
Iterator::Clone(Iterator *this)

{
  ParamIteratorInterface<std::tuple<unsigned_long,_unsigned_long>_> *pPVar1;
  
  pPVar1 = (ParamIteratorInterface<std::tuple<unsigned_long,_unsigned_long>_> *)operator_new(0x20);
  pPVar1->_vptr_ParamIteratorInterface = (_func_int **)&PTR__Iterator_0017ec70;
  pPVar1[1]._vptr_ParamIteratorInterface = (_func_int **)this->base_;
  pPVar1[2]._vptr_ParamIteratorInterface = (_func_int **)(this->iterator_)._M_current;
  pPVar1[3]._vptr_ParamIteratorInterface = (_func_int **)0x0;
  return pPVar1;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }